

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O2

uint Abc_TtCanonicizePhase(word *pTruth,int nVars)

{
  word wVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  uint nWords;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong *puVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar9;
  
  nWords = 1 << ((byte)nVars - 6 & 0x1f);
  if (nVars < 7) {
    nWords = 1;
  }
  uVar3 = 0;
  uVar6 = (ulong)(uint)nVars;
  if ((long)pTruth[(long)(int)nWords + -1] < 0) {
    Abc_TtNot(pTruth,nWords);
    uVar3 = 1 << ((byte)nVars & 0x1f);
  }
  do {
    uVar8 = (int)uVar6 - 1;
    uVar9 = (ulong)uVar8;
    if ((int)uVar6 < 7) {
      do {
        if ((int)uVar9 < 0) {
          return uVar3;
        }
        uVar8 = 1 << ((byte)uVar9 & 0x1f);
        uVar6 = s_Truths6[uVar9];
        uVar12 = (ulong)nWords;
        puVar13 = pTruth + nWords;
        do {
          puVar13 = puVar13 + -1;
          if ((int)uVar12 < 1) goto LAB_003ee627;
          bVar4 = (byte)uVar8;
          uVar15 = *puVar13 << (bVar4 & 0x3f) & uVar6;
          uVar14 = *puVar13 & uVar6;
          uVar12 = (ulong)((int)uVar12 - 1);
        } while (uVar15 == uVar14);
        if (uVar15 <= uVar14) {
          for (; -1 < (int)uVar12; uVar12 = (ulong)((int)uVar12 - 1)) {
            pTruth[uVar12] =
                 (pTruth[uVar12] & uVar6) >> (bVar4 & 0x3f) |
                 pTruth[uVar12] << (bVar4 & 0x3f) & uVar6;
          }
          uVar3 = uVar3 ^ uVar8;
        }
LAB_003ee627:
        uVar9 = (ulong)((int)uVar9 - 1);
      } while( true );
    }
    iVar7 = 1 << ((char)uVar6 - 7U & 0x1f);
    uVar2 = nWords - iVar7;
    uVar5 = nWords;
    while (uVar10 = uVar2, uVar11 = uVar5 - 1, uVar6 = uVar9, 1 < (int)uVar5) {
      if (pTruth[(int)(uVar11 - iVar7)] != pTruth[uVar11]) {
        if (pTruth[(int)(uVar11 - iVar7)] <= pTruth[uVar11]) {
          while (0 < (int)uVar11) {
            wVar1 = pTruth[(int)(uVar11 - iVar7)];
            pTruth[(int)(uVar11 - iVar7)] = pTruth[uVar11];
            pTruth[uVar11] = wVar1;
            uVar5 = uVar10 - iVar7;
            uVar2 = uVar5 - iVar7;
            if (uVar11 != uVar10) {
              uVar5 = uVar11;
              uVar2 = uVar10;
            }
            uVar10 = uVar2;
            uVar11 = uVar5 - 1;
          }
          if (uVar11 != 0xffffffff) {
            __assert_fail("w == -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauCanon.c"
                          ,0x3ce,"int Abc_TtCanonicizePhaseVar6(word *, int, int)");
          }
          uVar3 = uVar3 ^ 1 << (uVar8 & 0x1f);
        }
        break;
      }
      uVar5 = uVar10 - iVar7;
      uVar2 = uVar5 - iVar7;
      if (uVar11 != uVar10) {
        uVar2 = uVar10;
        uVar5 = uVar11;
      }
    }
  } while( true );
}

Assistant:

unsigned Abc_TtCanonicizePhase( word * pTruth, int nVars )
{
    unsigned uCanonPhase = 0;
    int v, nWords = Abc_TtWordNum( nVars );
//    static int Counter = 0;
//    Counter++;

#ifdef CANON_VERIFY
    static word pCopy1[1024];
    static word pCopy2[1024];
    Abc_TtCopy( pCopy1, pTruth, nWords, 0 );
#endif

    if ( (pTruth[nWords-1] >> 63) & 1 )
    {
        Abc_TtNot( pTruth, nWords );
        uCanonPhase ^= (1 << nVars);
    }

//    while ( 1 )
//    {
//        unsigned uCanonPhase2 = uCanonPhase;
        for ( v = nVars - 1; v >= 6; v-- )
            if ( Abc_TtCanonicizePhaseVar6( pTruth, nVars, v ) == 1 )
                uCanonPhase ^= 1 << v;
        for ( ; v >= 0; v-- )
            if ( Abc_TtCanonicizePhaseVar5( pTruth, nVars, v ) == 1 )
                uCanonPhase ^= 1 << v;
//        if ( uCanonPhase2 == uCanonPhase )
//            break;
//    }

//    for ( v = 5; v >= 0; v-- )
//        assert( Abc_TtCanonicizePhaseVar5( pTruth, nVars, v ) != 1 );

#ifdef CANON_VERIFY
    Abc_TtCopy( pCopy2, pTruth, nWords, 0 );
    Abc_TtImplementNpnConfig( pCopy2, nVars, NULL, uCanonPhase );
    if ( !Abc_TtEqual( pCopy1, pCopy2, nWords ) )
        printf( "Canonical form verification failed!\n" );
#endif
    return uCanonPhase;
}